

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

bool __thiscall S2Builder::EdgeChainSimplifier::IsInterior(EdgeChainSimplifier *this,VertexId v)

{
  Graph *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  vector<int,_std::allocator<int>_> *this_01;
  EdgeId *pEVar5;
  iterator __first;
  iterator __last;
  reference piVar6;
  Edge *pEVar7;
  int local_d8;
  VertexId VStack_d4;
  Edge edge;
  iterator iStack_c0;
  int layer;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_b8;
  iterator e_2;
  InteriorVertexMatcher matcher;
  EdgeId local_74;
  EdgeId *pEStack_70;
  EdgeId e_1;
  EdgeId *__end1_1;
  EdgeId *__begin1_1;
  VertexInEdgeIds *local_50;
  VertexInEdgeIds *__range1_1;
  Iterator local_40;
  EdgeId e;
  Iterator __end1;
  Iterator __begin1;
  VertexOutEdgeIds *__range1;
  vector<int,_std::allocator<int>_> *edges;
  VertexId v_local;
  EdgeChainSimplifier *this_local;
  
  iVar3 = Graph::VertexOutMap::degree(&this->out_,v);
  if (iVar3 != 0) {
    iVar3 = Graph::VertexOutMap::degree(&this->out_,v);
    iVar4 = Graph::VertexInMap::degree(&this->in_,v);
    if ((iVar3 == iVar4) && (this->builder_->num_forced_sites_ <= v)) {
      this_01 = &this->tmp_edges_;
      std::vector<int,_std::allocator<int>_>::clear(this_01);
      ___end1 = Graph::VertexOutMap::edge_ids(&this->out_,v);
      e = (EdgeId)Graph::VertexOutEdgeIds::begin((VertexOutEdgeIds *)&__end1);
      local_40 = Graph::VertexOutEdgeIds::end((VertexOutEdgeIds *)&__end1);
      while (bVar1 = Graph::VertexOutEdgeIds::Iterator::operator!=((Iterator *)&e,&local_40), bVar1)
      {
        pEVar5 = Graph::VertexOutEdgeIds::Iterator::operator*((Iterator *)&e);
        __range1_1._4_4_ = *pEVar5;
        std::vector<int,_std::allocator<int>_>::push_back
                  (this_01,(value_type_conflict1 *)((long)&__range1_1 + 4));
        Graph::VertexOutEdgeIds::Iterator::operator++((Iterator *)&e);
      }
      ___begin1_1 = Graph::VertexInMap::edge_ids(&this->in_,v);
      local_50 = (VertexInEdgeIds *)&__begin1_1;
      __end1_1 = Graph::VertexInEdgeIds::begin(local_50);
      pEStack_70 = Graph::VertexInEdgeIds::end(local_50);
      for (; __end1_1 != pEStack_70; __end1_1 = __end1_1 + 1) {
        local_74 = *__end1_1;
        std::vector<int,_std::allocator<int>_>::push_back(this_01,&local_74);
      }
      __first = std::vector<int,_std::allocator<int>_>::begin(this_01);
      __last = std::vector<int,_std::allocator<int>_>::end(this_01);
      std::
      sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,S2Builder::EdgeChainSimplifier::IsInterior(int)::__0>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 __first._M_current,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 __last._M_current,(anon_class_8_1_8991fb9c)this);
      InteriorVertexMatcher::InteriorVertexMatcher((InteriorVertexMatcher *)&e_2,v);
      local_b8._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(this_01);
      do {
        iStack_c0 = std::vector<int,_std::allocator<int>_>::end(this_01);
        bVar1 = __gnu_cxx::operator!=(&local_b8,&stack0xffffffffffffff40);
        if (!bVar1) {
          return true;
        }
        piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_b8);
        iVar3 = graph_edge_layer(this,*piVar6);
        InteriorVertexMatcher::StartLayer((InteriorVertexMatcher *)&e_2);
        while( true ) {
          edge = (Edge)std::vector<int,_std::allocator<int>_>::end(this_01);
          bVar2 = __gnu_cxx::operator!=
                            (&local_b8,
                             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             &edge);
          bVar1 = false;
          if (bVar2) {
            piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&local_b8);
            iVar4 = graph_edge_layer(this,*piVar6);
            bVar1 = iVar4 == iVar3;
          }
          if (!bVar1) break;
          this_00 = this->g_;
          piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_b8);
          pEVar7 = Graph::edge(this_00,*piVar6);
          local_d8 = (*pEVar7).first;
          VStack_d4 = (*pEVar7).second;
          if (local_d8 == v) {
            InteriorVertexMatcher::Tally((InteriorVertexMatcher *)&e_2,VStack_d4,true);
          }
          if (VStack_d4 == v) {
            InteriorVertexMatcher::Tally((InteriorVertexMatcher *)&e_2,local_d8,false);
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_b8);
        }
        bVar1 = InteriorVertexMatcher::Matches((InteriorVertexMatcher *)&e_2);
      } while (bVar1);
    }
  }
  return false;
}

Assistant:

bool S2Builder::EdgeChainSimplifier::IsInterior(VertexId v) {
  // Check a few simple prerequisites.
  if (out_.degree(v) == 0) return false;
  if (out_.degree(v) != in_.degree(v)) return false;
  if (v < builder_.num_forced_sites_) return false;  // Keep forced vertices.

  // Sort the edges so that they are grouped by layer.
  vector<EdgeId>& edges = tmp_edges_;  // Avoid allocating each time.
  edges.clear();
  for (EdgeId e : out_.edge_ids(v)) edges.push_back(e);
  for (EdgeId e : in_.edge_ids(v)) edges.push_back(e);
  std::sort(edges.begin(), edges.end(), [this](EdgeId x, EdgeId y) {
      return graph_edge_layer(x) < graph_edge_layer(y);
    });
  // Now feed the edges in each layer to the InteriorVertexMatcher.
  InteriorVertexMatcher matcher(v);
  for (auto e = edges.begin(); e != edges.end(); ) {
    int layer = graph_edge_layer(*e);
    matcher.StartLayer();
    for (; e != edges.end() && graph_edge_layer(*e) == layer; ++e) {
      Edge edge = g_.edge(*e);
      if (edge.first == v) matcher.Tally(edge.second, true /*outgoing*/);
      if (edge.second == v) matcher.Tally(edge.first, false /*outgoing*/);
    }
    if (!matcher.Matches()) return false;
  }
  return true;
}